

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<FlatBlockEstimatorTest,_testing::internal::Templates<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock,_gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Rb_tree_header *p_Var1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  CodeLocation *pCVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *code_location_00;
  undefined8 extraout_RAX;
  char *pcVar10;
  ulong uVar11;
  string test_name;
  allocator local_d9;
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  CodeLocation *local_a8;
  char *local_a0;
  key_type local_98;
  CodeLocation local_78;
  string local_50;
  
  local_a8 = code_location;
  local_a0 = prefix;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  pcVar8 = strchr(test_names,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,test_names,&local_d9);
  }
  else {
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,test_names,pcVar8);
  }
  local_98._M_dataplus._M_p = (pointer)local_d0;
  local_d8 = case_name;
  local_b0 = type_names;
  if (local_c8 != 0) {
    pcVar8 = local_d0->_M_local_buf + local_c8;
    do {
      paVar3 = local_d0;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_98._M_dataplus._M_p = (pointer)paVar3;
      if (iVar7 == 0) break;
      pcVar10 = pcVar8 + -1;
      uVar11 = (long)pcVar10 - (long)paVar3;
      std::__cxx11::string::_M_erase((ulong)&local_d0,uVar11);
      pcVar8 = local_d0->_M_local_buf + uVar11;
      local_98._M_dataplus._M_p = (pointer)local_d0;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar10 != paVar3);
  }
  pCVar5 = local_a8;
  type_names_00 = local_b0;
  pcVar8 = local_d8;
  local_d0 = &local_c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == local_d0) {
    local_98.field_2._8_8_ = local_c0._8_8_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  local_98._M_string_length = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find(&(state->registered_tests_)._M_t,&local_98);
  p_Var1 = &(state->registered_tests_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)(pCVar5->file)._M_dataplus._M_p,
               (char *)(ulong)(uint)pCVar5->line,(int)p_Var1);
    TypeParameterizedTestSuite<FlatBlockEstimatorTest,testing::internal::Templates<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock,gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks>,testing::internal::Types<BitDepthParams<unsigned_char,8,false>,BitDepthParams<unsigned_short,8,true>,BitDepthParams<unsigned_short,10,true>,BitDepthParams<unsigned_short,12,true>>>
    ::Register();
    _Unwind_Resume(extraout_RAX);
  }
  code_location_00 = TypedTestSuitePState::GetCodeLocation(state,&local_98);
  TypeParameterizedTest<FlatBlockEstimatorTest,_testing::internal::TemplateSel<gtest_suite_FlatBlockEstimatorTest_::ExtractBlock>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
  ::Register(local_a0,code_location_00,pcVar8,test_names,0,type_names_00);
  paVar3 = &local_78.file.field_2;
  pcVar4 = (pCVar5->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,pcVar4 + (pCVar5->file)._M_string_length);
  local_78.line = pCVar5->line;
  pcVar10 = strchr(test_names,0x2c);
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    do {
      pbVar2 = (byte *)(pcVar10 + 1);
      pcVar10 = pcVar10 + 1;
      iVar7 = isspace((uint)*pbVar2);
    } while (iVar7 != 0);
  }
  bVar6 = TypeParameterizedTestSuite<FlatBlockEstimatorTest,_testing::internal::Templates<gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
          ::Register(local_a0,&local_78,state,pcVar8,pcVar10,type_names_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }